

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O2

bool __thiscall basisu::basisu_frontend::compress(basisu_frontend *this)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t refine_selector_steps;
  uint32_t iter;
  uint step;
  char buf [256];
  
  debug_printf("basisu_frontend::compress\n");
  uVar4 = (this->m_params).m_num_source_blocks;
  this->m_total_blocks = uVar4;
  this->m_total_pixels = uVar4 << 4;
  init_etc1_images(this);
  if ((this->m_params).m_pGlobal_codebooks == (basisu_lowlevel_etc1s_transcoder *)0x0) {
    init_endpoint_training_vectors(this);
    generate_endpoint_clusters(this);
    step = 0;
    do {
      bVar2 = (this->m_params).m_validate;
      if (this->m_num_endpoint_codebook_iterations <= step) goto LAB_00223f59;
      if ((bVar2 & 1) != 0) {
        bVar3 = check_etc1s_constraints(this);
        if (!bVar3) {
          handle_verify_failure(0xba);
        }
        bVar3 = validate_endpoint_cluster_hierarchy(this,false);
        if (!bVar3) {
          handle_verify_failure(0xbc);
        }
      }
      if (step != 0) {
        introduce_new_endpoint_clusters(this);
      }
      if (((this->m_params).m_validate == true) &&
         (bVar3 = validate_endpoint_cluster_hierarchy(this,false), !bVar3)) {
        handle_verify_failure(0xc6);
      }
      generate_endpoint_codebook(this,step);
      if (((this->m_params).m_debug_images == true) &&
         ((this->m_params).m_dump_endpoint_clusterization == true)) {
        snprintf(buf,0x100,"endpoint_cluster_vis_pre_%u.png",(ulong)step);
        dump_endpoint_clusterization_visualization(this,buf,false);
      }
      if (this->m_endpoint_refinement == true) {
        uVar4 = refine_endpoint_clusterization(this);
        bVar3 = uVar4 == 0;
        if (((step == 0) && ((this->m_params).m_tex_type == cBASISTexTypeVideoFrames)) &&
           (this->m_num_endpoint_codebook_iterations == 1)) {
          eliminate_redundant_or_empty_endpoint_clusters(this);
          generate_endpoint_codebook(this,1);
        }
        if (((this->m_params).m_debug_images == true) &&
           ((this->m_params).m_dump_endpoint_clusterization == true)) {
          snprintf(buf,0x100,"endpoint_cluster_vis_post_%u.png",(ulong)step);
          dump_endpoint_clusterization_visualization(this,buf,false);
          snprintf(buf,0x100,"endpoint_cluster_colors_vis_post_%u.png",(ulong)step);
          dump_endpoint_clusterization_visualization(this,buf,true);
        }
      }
      else {
        bVar3 = false;
      }
      if (((this->m_params).m_validate == true) &&
         (bVar1 = validate_endpoint_cluster_hierarchy(this,false), !bVar1)) {
        handle_verify_failure(0xef);
      }
      eliminate_redundant_or_empty_endpoint_clusters(this);
      if (((this->m_params).m_validate == true) &&
         (bVar1 = validate_endpoint_cluster_hierarchy(this,false), !bVar1)) {
        handle_verify_failure(0xf6);
      }
      if ((this->m_params).m_debug_stats == true) {
        debug_printf("Total endpoint clusters: %u\n");
      }
      step = step + 1;
    } while (!bVar3);
    bVar2 = (this->m_params).m_validate;
LAB_00223f59:
    if (((bVar2 & 1) != 0) && (bVar3 = check_etc1s_constraints(this), !bVar3)) {
      handle_verify_failure(0x102);
    }
    generate_block_endpoint_clusters(this);
    create_initial_packed_texture(this);
    generate_selector_clusters(this);
    if (this->m_use_hierarchical_selector_codebooks == true) {
      compute_selector_clusters_within_each_parent_cluster(this);
    }
    if ((this->m_params).m_compression_level == 0) {
      create_optimized_selector_codebook(this,0);
      find_optimal_selector_clusters_for_each_block(this);
      introduce_special_selector_clusters(this);
    }
    else {
      uVar4 = this->m_num_selector_codebook_iterations;
      for (iter = 0; uVar4 != iter; iter = iter + 1) {
        create_optimized_selector_codebook(this,iter);
        find_optimal_selector_clusters_for_each_block(this);
        introduce_special_selector_clusters(this);
        if (((3 < (this->m_params).m_compression_level) ||
            ((this->m_params).m_tex_type == cBASISTexTypeVideoFrames)) &&
           (uVar5 = refine_block_endpoints_given_selectors(this), uVar5 == 0)) break;
      }
    }
    optimize_selector_codebook(this);
    if ((this->m_params).m_debug_stats == true) {
      debug_printf("Total selector clusters: %u\n",
                   (ulong)(this->m_selector_cluster_block_indices).m_size);
    }
  }
  else {
    init_global_codebooks(this);
  }
  finalize(this);
  if (((this->m_params).m_validate == true) && (bVar3 = validate_output(this), !bVar3)) {
    return false;
  }
  debug_printf("basisu_frontend::compress: Done\n");
  return true;
}

Assistant:

bool basisu_frontend::compress()
	{
		debug_printf("basisu_frontend::compress\n");

		m_total_blocks = m_params.m_num_source_blocks;
		m_total_pixels = m_total_blocks * cPixelBlockTotalPixels;

		// Encode the initial high quality ETC1S texture

		init_etc1_images();

		// First quantize the ETC1S endpoints

		if (m_params.m_pGlobal_codebooks)
		{
			init_global_codebooks();
		}
		else
		{
			init_endpoint_training_vectors();

			generate_endpoint_clusters();

			for (uint32_t refine_endpoint_step = 0; refine_endpoint_step < m_num_endpoint_codebook_iterations; refine_endpoint_step++)
			{
				if (m_params.m_validate)
				{
					BASISU_FRONTEND_VERIFY(check_etc1s_constraints());

					BASISU_FRONTEND_VERIFY(validate_endpoint_cluster_hierarchy(false));
				}

				if (refine_endpoint_step)
				{
					introduce_new_endpoint_clusters();
				}

				if (m_params.m_validate)
				{
					BASISU_FRONTEND_VERIFY(validate_endpoint_cluster_hierarchy(false));
				}

				generate_endpoint_codebook(refine_endpoint_step);

				if ((m_params.m_debug_images) && (m_params.m_dump_endpoint_clusterization))
				{
					char buf[256];
					snprintf(buf, sizeof(buf), "endpoint_cluster_vis_pre_%u.png", refine_endpoint_step);
					dump_endpoint_clusterization_visualization(buf, false);
				}

				bool early_out = false;

				if (m_endpoint_refinement)
				{
					//dump_endpoint_clusterization_visualization("endpoint_clusters_before_refinement.png");

					if (!refine_endpoint_clusterization())
						early_out = true;

					if ((m_params.m_tex_type == basist::cBASISTexTypeVideoFrames) && (!refine_endpoint_step) && (m_num_endpoint_codebook_iterations == 1))
					{
						eliminate_redundant_or_empty_endpoint_clusters();
						generate_endpoint_codebook(basisu::maximum(1U, refine_endpoint_step));
					}

					if ((m_params.m_debug_images) && (m_params.m_dump_endpoint_clusterization))
					{
						char buf[256];
						snprintf(buf, sizeof(buf), "endpoint_cluster_vis_post_%u.png", refine_endpoint_step);

						dump_endpoint_clusterization_visualization(buf, false);
						snprintf(buf, sizeof(buf), "endpoint_cluster_colors_vis_post_%u.png", refine_endpoint_step);

						dump_endpoint_clusterization_visualization(buf, true);
					}
				}

				if (m_params.m_validate)
				{
					BASISU_FRONTEND_VERIFY(validate_endpoint_cluster_hierarchy(false));
				}
						
				eliminate_redundant_or_empty_endpoint_clusters();

				if (m_params.m_validate)
				{
					BASISU_FRONTEND_VERIFY(validate_endpoint_cluster_hierarchy(false));
				}

				if (m_params.m_debug_stats)
					debug_printf("Total endpoint clusters: %u\n", (uint32_t)m_endpoint_clusters.size());

				if (early_out)
					break;
			}
			
			if (m_params.m_validate)
			{
				BASISU_FRONTEND_VERIFY(check_etc1s_constraints());
			}

			generate_block_endpoint_clusters();

			create_initial_packed_texture();

			// Now quantize the ETC1S selectors

			generate_selector_clusters();

			if (m_use_hierarchical_selector_codebooks)
				compute_selector_clusters_within_each_parent_cluster();
				
			if (m_params.m_compression_level == 0)
			{
				create_optimized_selector_codebook(0);

				find_optimal_selector_clusters_for_each_block();
							
				introduce_special_selector_clusters();
			}
			else
			{
				const uint32_t num_refine_selector_steps = m_num_selector_codebook_iterations;
				for (uint32_t refine_selector_steps = 0; refine_selector_steps < num_refine_selector_steps; refine_selector_steps++)
				{
					create_optimized_selector_codebook(refine_selector_steps);

					find_optimal_selector_clusters_for_each_block();

					introduce_special_selector_clusters();

					if ((m_params.m_compression_level >= 4) || (m_params.m_tex_type == basist::cBASISTexTypeVideoFrames))
					{
						if (!refine_block_endpoints_given_selectors())
							break;
					}
				}
			}
				
			optimize_selector_codebook();

			if (m_params.m_debug_stats)
				debug_printf("Total selector clusters: %u\n", (uint32_t)m_selector_cluster_block_indices.size());
		}

		finalize();

		if (m_params.m_validate)
		{
			if (!validate_output())
				return false;
		}

		debug_printf("basisu_frontend::compress: Done\n");

		return true;
	}